

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> *this;
  idx_t size;
  Vector *vector;
  STORAGE_TYPE *pSVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t i_1;
  ulong uVar5;
  long lVar6;
  HeapEntry<duckdb::string_t> *value;
  ulong uVar7;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar6 = 0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(local_78.sel)->sel_vector[iVar3];
    }
    lVar6 = lVar6 + *(long *)(*(long *)(local_78.data + iVar4 * 8) + 0x10);
  }
  ListVector::Reserve(result,lVar6 + size);
  pdVar1 = result->data;
  vector = ListVector::GetEntry(result);
  for (uVar5 = 0; uVar5 != count; uVar5 = uVar5 + 1) {
    uVar7 = uVar5;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(local_78.sel)->sel_vector[uVar5];
    }
    this = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> **)
            (local_78.data + uVar7 * 8);
    if (((char)this[1].capacity == '\x01') && (iVar3 = this->size, iVar3 != 0)) {
      lVar6 = (uVar5 + offset) * 0x10;
      *(idx_t *)(pdVar1 + lVar6) = size;
      *(idx_t *)(pdVar1 + lVar6 + 8) = iVar3;
      pSVar2 = BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan>::
               SortAndGetHeap(this);
      value = &pSVar2->second;
      for (uVar7 = 0; iVar3 = size + uVar7, uVar7 < this->size; uVar7 = uVar7 + 1) {
        MinMaxFallbackValue::Assign(vector,iVar3,&value->value);
        value = value + 2;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar5 + offset);
      iVar3 = size;
    }
    size = iVar3;
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}